

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::MemoryUsage(void)

{
  bool bVar1;
  Regexp *this;
  Prog *this_00;
  ulong extraout_RAX;
  PCRE *this_01;
  StringPiece sp [4];
  PCRE re;
  
  re.pattern_._M_dataplus._M_p = "(\\d+)-(\\d+)-(\\d+)";
  re.pattern_._M_string_length._0_4_ = 0x11;
  this = Regexp::Parse((StringPiece *)&re,LikePerl,(RegexpStatus *)0x0);
  if (this == (Regexp *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&re,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x2f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&re.pattern_._M_string_length,"Check failed: re",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re);
  }
  fprintf(_stderr,"Regexp: %7lld bytes (peak=%lld)\n",0,0);
  this_00 = Regexp::CompileToProg(this,0);
  if (this_00 == (Prog *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&re,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x36,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&re.pattern_._M_string_length,"Check failed: prog",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re);
  }
  bVar1 = Prog::IsOnePass(this_00);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)&re,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x37,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&re.pattern_._M_string_length,"Check failed: prog->IsOnePass()",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re);
  }
  MemoryUsage();
  if ((extraout_RAX & 1) == 0) {
    LogMessage::LogMessage
              ((LogMessage *)&re,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&re.pattern_._M_string_length,
               "Check failed: prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
               ,0x57);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&re);
  }
  fprintf(_stderr,"Search: %7lld bytes (peak=%lld)\n",0,0);
  Prog::~Prog(this_00);
  operator_delete(this_00);
  Regexp::Decref(this);
  PCRE::PCRE(&re,"(\\d+)-(\\d+)-(\\d+)",EnabledCompileOptions);
  fprintf(_stderr,"RE:     %7lld bytes (peak=%lld)\n",0,0);
  sp[0].ptr_ = "650-253-0001";
  sp[0].length_ = 0xc;
  PCRE::FullMatchFunctor::operator()
            ((FullMatchFunctor *)&PCRE::FullMatch,sp,&re,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args);
  fprintf(_stderr,"RE:     %7lld bytes (peak=%lld)\n",0,0);
  PCRE::~PCRE(&re);
  this_01 = (PCRE *)operator_new(0x50);
  PCRE::PCRE(this_01,"(\\d+)-(\\d+)-(\\d+)",EnabledCompileOptions);
  fprintf(_stderr,"PCRE*:  %7lld bytes (peak=%lld)\n",0,0);
  re.pattern_._M_dataplus._M_p = "650-253-0001";
  re.pattern_._M_string_length._0_4_ = 0xc;
  PCRE::FullMatchFunctor::operator()
            ((FullMatchFunctor *)&PCRE::FullMatch,(StringPiece *)&re,this_01,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
             (Arg *)PCRE::no_more_args);
  fprintf(_stderr,"PCRE*:  %7lld bytes (peak=%lld)\n",0);
  PCRE::~PCRE(this_01);
  operator_delete(this_01);
  RE2::RE2((RE2 *)&re,"(\\d+)-(\\d+)-(\\d+)");
  fprintf(_stderr,"RE2:    %7lld bytes (peak=%lld)\n",0);
  sp[0].ptr_ = "650-253-0001";
  sp[0].length_ = 0xc;
  RE2::FullMatchN(sp,(RE2 *)&re,(Arg **)0x0,0);
  MemoryUsage();
  return;
}

Assistant:

void MemoryUsage() {
  const char* regexp = "(\\d+)-(\\d+)-(\\d+)";
  const char* text = "650-253-0001";
  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    // Can't pass mc.HeapGrowth() and mc.PeakHeapGrowth() to LOG(INFO) directly,
    // because LOG(INFO) might do a big allocation before they get evaluated.
    fprintf(stderr, "Regexp: %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    mc.Reset();

    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    CHECK(prog->IsOnePass());
    fprintf(stderr, "Prog:   %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    mc.Reset();

    StringPiece sp[4];
    CHECK(prog->SearchOnePass(text, text, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    fprintf(stderr, "Search: %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    delete prog;
    re->Decref();
  }

  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);

    PCRE re(regexp, PCRE::UTF8);
    fprintf(stderr, "RE:     %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    PCRE::FullMatch(text, re);
    fprintf(stderr, "RE:     %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
  }

  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);

    PCRE* re = new PCRE(regexp, PCRE::UTF8);
    fprintf(stderr, "PCRE*:  %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    PCRE::FullMatch(text, *re);
    fprintf(stderr, "PCRE*:  %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    delete re;
  }

  {
    MallocCounter mc(MallocCounter::THIS_THREAD_ONLY);

    RE2 re(regexp);
    fprintf(stderr, "RE2:    %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
    RE2::FullMatch(text, re);
    fprintf(stderr, "RE2:    %7lld bytes (peak=%lld)\n", mc.HeapGrowth(), mc.PeakHeapGrowth());
  }

  fprintf(stderr, "sizeof: PCRE=%d RE2=%d Prog=%d Inst=%d\n",
          static_cast<int>(sizeof(PCRE)),
          static_cast<int>(sizeof(RE2)),
          static_cast<int>(sizeof(Prog)),
          static_cast<int>(sizeof(Prog::Inst)));
}